

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

from_chars_result __thiscall
semver::detail::version_parser::parse<long,long,long>
          (version_parser *this,version<long,_long,_long> *out)

{
  pointer ptVar1;
  token_type tVar2;
  size_t sVar3;
  from_chars_result fVar4;
  from_chars_result fVar5;
  byte *pbVar6;
  size_t sVar7;
  pointer ptVar8;
  token_stream *ptVar10;
  pointer ptVar11;
  undefined8 uVar12;
  ulong uVar13;
  from_chars_result fVar14;
  undefined8 local_38;
  char *local_30;
  char *pcVar9;
  
  out->major_ = 0;
  out->minor_ = 1;
  out->patch_ = 0;
  (out->prerelease_tag_)._M_string_length = 0;
  *(out->prerelease_tag_)._M_dataplus._M_p = '\0';
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::_M_erase_at_end(&out->prerelease_identifiers,
                    (out->prerelease_identifiers).
                    super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (out->build_metadata_)._M_string_length = 0;
  *(out->build_metadata_)._M_dataplus._M_p = '\0';
  ptVar10 = this->stream;
  sVar7 = ptVar10->current;
  ptVar11 = (ptVar10->tokens).
            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ptVar8 = ptVar11 + sVar7;
  local_38._0_1_ = ptVar8->type;
  local_38._1_2_ = ptVar8->value;
  local_38._3_5_ = *(undefined5 *)&ptVar8->field_0x3;
  local_30 = ptVar11[sVar7].lexeme;
  ptVar10->current = sVar7 + 1;
  if ((undefined1)local_38 == '\x06') {
    pbVar6 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         *)((long)&local_38 + 1));
    uVar13 = (ulong)*pbVar6;
    ptVar10 = this->stream;
    if (uVar13 == 0) {
      uVar13 = 0;
    }
    else {
      sVar7 = ptVar10->current;
      ptVar11 = (ptVar10->tokens).
                super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ptVar8 = ptVar11 + sVar7;
      local_38._0_1_ = ptVar8->type;
      local_38._1_2_ = ptVar8->value;
      local_38._3_5_ = *(undefined5 *)&ptVar8->field_0x3;
      if ((undefined1)local_38 == '\x06') {
        ptVar11 = ptVar11 + sVar7;
        do {
          local_30 = ptVar11->lexeme;
          ptVar10->current = sVar7 + 1;
          pbVar6 = std::
                   get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                             ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                               *)((long)&local_38 + 1));
          uVar13 = (ulong)*pbVar6 + uVar13 * 10;
          ptVar10 = this->stream;
          sVar7 = ptVar10->current;
          ptVar8 = (ptVar10->tokens).
                   super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ptVar11 = ptVar8 + sVar7;
          ptVar8 = ptVar8 + sVar7;
          local_38._0_1_ = ptVar8->type;
          local_38._1_2_ = ptVar8->value;
          local_38._3_5_ = *(undefined5 *)&ptVar8->field_0x3;
        } while ((undefined1)local_38 == '\x06');
        if ((long)uVar13 < 0) goto LAB_001044b9;
      }
    }
    out->major_ = uVar13;
    sVar3 = ptVar10->current;
    ptVar8 = (ptVar10->tokens).
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    tVar2 = ptVar8[sVar3].type;
    sVar7 = sVar3 + 1;
    ptVar10->current = sVar7;
    if (tVar2 == dot) {
      ptVar11 = ptVar8 + sVar7;
      local_38._0_1_ = ptVar11->type;
      local_38._1_2_ = ptVar11->value;
      local_38._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
      local_30 = ptVar8[sVar7].lexeme;
      ptVar10->current = sVar3 + 2;
      if ((undefined1)local_38 != '\x06') goto LAB_0010469e;
      pbVar6 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                           *)((long)&local_38 + 1));
      uVar13 = (ulong)*pbVar6;
      ptVar10 = this->stream;
      if (uVar13 == 0) {
        uVar13 = 0;
      }
      else {
        sVar7 = ptVar10->current;
        ptVar11 = (ptVar10->tokens).
                  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ptVar8 = ptVar11 + sVar7;
        local_38._0_1_ = ptVar8->type;
        local_38._1_2_ = ptVar8->value;
        local_38._3_5_ = *(undefined5 *)&ptVar8->field_0x3;
        if ((undefined1)local_38 == '\x06') {
          ptVar11 = ptVar11 + sVar7;
          do {
            local_30 = ptVar11->lexeme;
            ptVar10->current = sVar7 + 1;
            pbVar6 = std::
                     get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                               ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                                 *)((long)&local_38 + 1));
            uVar13 = (ulong)*pbVar6 + uVar13 * 10;
            ptVar10 = this->stream;
            sVar7 = ptVar10->current;
            ptVar8 = (ptVar10->tokens).
                     super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ptVar11 = ptVar8 + sVar7;
            ptVar8 = ptVar8 + sVar7;
            local_38._0_1_ = ptVar8->type;
            local_38._1_2_ = ptVar8->value;
            local_38._3_5_ = *(undefined5 *)&ptVar8->field_0x3;
          } while ((undefined1)local_38 == '\x06');
          if ((long)uVar13 < 0) goto LAB_001044b9;
        }
      }
      out->minor_ = uVar13;
      sVar3 = ptVar10->current;
      ptVar8 = (ptVar10->tokens).
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tVar2 = ptVar8[sVar3].type;
      sVar7 = sVar3 + 1;
      ptVar10->current = sVar7;
      if (tVar2 == dot) {
        ptVar11 = ptVar8 + sVar7;
        local_38._0_1_ = ptVar11->type;
        local_38._1_2_ = ptVar11->value;
        local_38._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
        local_30 = ptVar8[sVar7].lexeme;
        ptVar10->current = sVar3 + 2;
        if ((undefined1)local_38 == '\x06') {
          pbVar6 = std::
                   get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                             ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                               *)((long)&local_38 + 1));
          uVar13 = (ulong)*pbVar6;
          if (uVar13 == 0) {
            out->patch_ = 0;
            ptVar10 = this->stream;
            ptVar8 = (ptVar10->tokens).
                     super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                     ._M_impl.super__Vector_impl_data._M_start + ptVar10->current;
          }
          else {
            ptVar10 = this->stream;
            sVar7 = ptVar10->current;
            ptVar8 = (ptVar10->tokens).
                     super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ptVar11 = ptVar8 + sVar7;
            uVar12._0_1_ = ptVar11->type;
            uVar12._1_2_ = ptVar11->value;
            uVar12._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
            if ((undefined1)uVar12 == '\x06') {
              ptVar11 = ptVar8 + sVar7;
              do {
                local_30 = ptVar11->lexeme;
                ptVar10->current = sVar7 + 1;
                local_38 = uVar12;
                pbVar6 = std::
                         get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                                   ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                                     *)((long)&local_38 + 1));
                uVar13 = (ulong)*pbVar6 + uVar13 * 10;
                ptVar10 = this->stream;
                sVar7 = ptVar10->current;
                ptVar8 = (ptVar10->tokens).
                         super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ptVar11 = ptVar8 + sVar7;
                ptVar1 = ptVar8 + sVar7;
                uVar12._0_1_ = ptVar1->type;
                uVar12._1_2_ = ptVar1->value;
                uVar12._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
              } while ((undefined1)uVar12 == '\x06');
              if ((long)uVar13 < 0) {
LAB_001044b9:
                fVar14._8_8_ = 0x22;
                fVar14.ptr = local_30;
                return (from_chars_result)fVar14;
              }
            }
            out->patch_ = uVar13;
            ptVar8 = ptVar8 + ptVar10->current;
          }
          sVar7 = ptVar10->current;
          tVar2 = (ptVar10->tokens).
                  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                  _M_impl.super__Vector_impl_data._M_start[sVar7].type;
          if (tVar2 == hyphen) {
            ptVar10->current = sVar7 + 1;
            fVar14 = (from_chars_result)
                     parse_prerelease_tag(this,&out->prerelease_tag_,&out->prerelease_identifiers);
            pcVar9 = fVar14.ptr;
            if (fVar14.ec != 0) {
              return (from_chars_result)fVar14;
            }
            ptVar10 = this->stream;
            sVar7 = ptVar10->current;
            tVar2 = (ptVar10->tokens).
                    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar7].type;
          }
          else {
            pcVar9 = ptVar8->lexeme;
          }
          fVar4._8_8_ = 0;
          fVar4.ptr = pcVar9;
          if (tVar2 != plus) {
            return (from_chars_result)fVar4;
          }
          ptVar10->current = sVar7 + 1;
          fVar14 = (from_chars_result)parse_build_metadata(this,&out->build_metadata_);
          return (from_chars_result)fVar14;
        }
        goto LAB_0010469e;
      }
    }
    local_30 = ptVar8[sVar7 - 1].lexeme;
  }
LAB_0010469e:
  fVar5._8_8_ = 0x16;
  fVar5.ptr = local_30;
  return (from_chars_result)fVar5;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(version<I1, I2, I3>& out) noexcept {
    out.clear();

    from_chars_result result = parse_number(out.major_); 
    if (!result) {
      return result;
    }

    if (!stream.consume(token_type::dot)) {
      return failure(stream.previous().lexeme);
    }

    result = parse_number(out.minor_);
    if (!result) {
      return result;
    }

    if (!stream.consume(token_type::dot)) {
      return failure(stream.previous().lexeme);
    }

    result = parse_number(out.patch_);
    if (!result) {
      return result;
    }

    if (stream.advanceIfMatch(token_type::hyphen)) {
      result = parse_prerelease_tag(out.prerelease_tag_, out.prerelease_identifiers);
      if (!result) {
        return result;
      }
    }

    if (stream.advanceIfMatch(token_type::plus)) {
      result = parse_build_metadata(out.build_metadata_);
      if (!result) {
        return result;
      }
    }

    return result;
  }